

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  bool bVar1;
  char *description;
  Descriptor *pDVar2;
  Metadata MVar3;
  string_view sVar4;
  
  MVar3 = Message::GetMetadata(message);
  if (MVar3.reflection != this) {
    pDVar2 = this->descriptor_;
    MVar3 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar3.descriptor,field,"GetStringView")
    ;
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
        sVar4 = GetStringViewImpl(this,message,field,scratch);
        return sVar4;
      }
      anon_unknown_6::ReportReflectionUsageTypeError
                (this->descriptor_,field,"GetStringView",CPPTYPE_STRING);
    }
    pDVar2 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetStringView",description);
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);
  return GetStringViewImpl(message, field, &scratch);
}